

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall SGParser::Generator::RegExprDFAParseElement::Destroy(RegExprDFAParseElement *this)

{
  void *pvVar1;
  pointer ppRVar2;
  pointer puVar3;
  ulong uVar4;
  RegExprDFANode *pRVar5;
  
  if (this->DataType == Node) {
    pRVar5 = (this->field_1).pNode;
    if (pRVar5 != (RegExprDFANode *)0x0) {
      ppRVar2 = (pRVar5->Children).
                super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppRVar2 != (pointer)0x0) {
        operator_delete(ppRVar2,(long)(pRVar5->Children).
                                      super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppRVar2);
      }
      puVar3 = (pRVar5->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3,(long)(pRVar5->LastPos).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar3);
      }
      puVar3 = (pRVar5->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3,(long)(pRVar5->FirstPos).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar3);
      }
      puVar3 = (pRVar5->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3,(long)(pRVar5->Chars).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar3);
      }
    }
    uVar4 = 0x80;
  }
  else {
    if (this->DataType != Chars) goto LAB_0014418f;
    pRVar5 = (RegExprDFANode *)(this->field_1).pChars;
    if ((pRVar5 != (RegExprDFANode *)0x0) && (pvVar1 = *(void **)pRVar5, pvVar1 != (void *)0x0)) {
      operator_delete(pvVar1,(long)(pRVar5->Chars).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)pvVar1);
    }
    uVar4 = 0x18;
  }
  operator_delete(pRVar5,uVar4);
LAB_0014418f:
  this->DataType = Null;
  return;
}

Assistant:

void Destroy() {
        switch (DataType) {
            case RegExprDataType::Chars: delete pChars; break;
            case RegExprDataType::Node:  delete pNode;  break;
            default:                                    break;
        }
        DataType = RegExprDataType::Null;
    }